

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_refresh_controls_are_not_removed_as_results_of_a_non_refresh_registration_Test
::
~SubjectSetRegisterTest_next_subscription_sync_after_refresh_controls_are_not_removed_as_results_of_a_non_refresh_registration_Test
          (SubjectSetRegisterTest_next_subscription_sync_after_refresh_controls_are_not_removed_as_results_of_a_non_refresh_registration_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_refresh_controls_are_not_removed_as_results_of_a_non_refresh_registration)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();

    subject_register.Register(SS_SUBJECT0, true); // causes refresh
    subject_register.Register(SS_SUBJECT0, false); // no refresh required by does no revert the refresh
    message = subject_register.NextSubscriptionSync();
    EXPECT_EQ(ControlOperationEnum::REFRESH, message->GetControls().begin()->second);
}